

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

Error __thiscall asmjit::ZoneBitVector::fill(ZoneBitVector *this,size_t from,size_t to,bool value)

{
  long lVar1;
  byte bVar2;
  byte in_CL;
  sbyte sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong in_RDX;
  ulong in_RSI;
  long *in_RDI;
  BitWord mask_2;
  BitWord pattern;
  BitWord mask_1;
  BitWord mask;
  size_t nBits;
  BitWord *data;
  size_t endBit;
  size_t endIdx;
  size_t startBit;
  size_t idx;
  BitWord bitAsWord;
  char *in_stack_00000360;
  int in_stack_0000036c;
  char *in_stack_00000370;
  bool local_91;
  ulong local_40;
  Error local_18;
  
  bVar2 = in_CL & 1;
  if (in_RSI < in_RDX) {
    if ((ulong)in_RDI[1] < in_RSI) {
      DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
    }
    if ((ulong)in_RDI[1] < in_RDX) {
      DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
    }
    local_40 = in_RSI >> 6;
    uVar4 = in_RSI & 0x3f;
    uVar5 = in_RDX >> 6;
    uVar6 = in_RDX & 0x3f;
    lVar1 = *in_RDI;
    if (lVar1 == 0) {
      DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
    }
    if (uVar4 != 0) {
      sVar3 = (sbyte)uVar4;
      if (local_40 == uVar5) {
        if (uVar4 < uVar6) {
          uVar4 = (1L << ((sbyte)uVar6 - sVar3 & 0x3fU)) + -1 << sVar3;
          if (bVar2 == 0) {
            *(ulong *)(lVar1 + local_40 * 8) =
                 (uVar4 ^ 0xffffffffffffffff) & *(ulong *)(lVar1 + local_40 * 8);
          }
          else {
            *(ulong *)(lVar1 + local_40 * 8) = uVar4 | *(ulong *)(lVar1 + local_40 * 8);
          }
          return 0;
        }
        DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
      }
      if (bVar2 == 0) {
        *(ulong *)(lVar1 + local_40 * 8) =
             (-1L << sVar3 ^ 0xffffffffffffffffU) & *(ulong *)(lVar1 + local_40 * 8);
      }
      else {
        *(ulong *)(lVar1 + local_40 * 8) = -1L << sVar3 | *(ulong *)(lVar1 + local_40 * 8);
      }
      local_40 = local_40 + 1;
    }
    if (local_40 < uVar5) {
      local_91 = 1 < (ulong)bVar2;
      if (local_91) {
        DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
      }
      do {
        uVar4 = local_40 + 1;
        *(ulong *)(lVar1 + local_40 * 8) = -(ulong)bVar2;
        local_40 = uVar4;
      } while (uVar4 < uVar5);
    }
    if (uVar6 != 0) {
      uVar4 = (1L << (sbyte)uVar6) - 1;
      if (bVar2 == 0) {
        *(ulong *)(lVar1 + uVar5 * 8) = (uVar4 ^ 0xffffffffffffffff) & *(ulong *)(lVar1 + uVar5 * 8)
        ;
      }
      else {
        *(ulong *)(lVar1 + uVar5 * 8) = uVar4 | *(ulong *)(lVar1 + uVar5 * 8);
      }
    }
    local_18 = 0;
  }
  else if (in_RDX < in_RSI) {
    local_18 = 3;
  }
  else {
    local_18 = 0;
  }
  return local_18;
}

Assistant:

Error ZoneBitVector::fill(size_t from, size_t to, bool value) noexcept {
  if (ASMJIT_UNLIKELY(from >= to)) {
    if (from > to)
      return DebugUtils::errored(kErrorInvalidArgument);
    else
      return kErrorOk;
  }

  ASMJIT_ASSERT(from <= _length);
  ASMJIT_ASSERT(to <= _length);

  // This is very similar to `ZoneBitVector::_fill()`, however, since we
  // actually set bits that are already part of the container we need to
  // special case filiing to zeros and ones.
  size_t idx = from / kBitsPerWord;
  size_t startBit = from % kBitsPerWord;

  size_t endIdx = to / kBitsPerWord;
  size_t endBit = to % kBitsPerWord;

  BitWord* data = _data;
  ASMJIT_ASSERT(data != nullptr);

  // Special case for non-zero `startBit`.
  if (startBit) {
    if (idx == endIdx) {
      ASMJIT_ASSERT(startBit < endBit);

      size_t nBits = endBit - startBit;
      BitWord mask = ((static_cast<BitWord>(1) << nBits) - 1) << startBit;

      if (value)
        data[idx] |= mask;
      else
        data[idx] &= ~mask;
      return kErrorOk;
    }
    else {
      BitWord mask = (static_cast<BitWord>(0) - 1) << startBit;

      if (value)
        data[idx++] |= mask;
      else
        data[idx++] &= ~mask;
    }
  }

  // Fill all bits in case there is a gap between the current `idx` and `endIdx`.
  if (idx < endIdx) {
    BitWord pattern = _patternFromBit(value);
    do {
      data[idx++] = pattern;
    } while (idx < endIdx);
  }

  // Special case for non-zero `endBit`.
  if (endBit) {
    BitWord mask = ((static_cast<BitWord>(1) << endBit) - 1);
    if (value)
      data[endIdx] |= mask;
    else
      data[endIdx] &= ~mask;
  }

  return kErrorOk;
}